

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end_to_end_ssim_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2185f04::EndToEndSSIMTest::CalculateFrameLevelSSIM
          (EndToEndSSIMTest *this,aom_image_t *img_src,aom_image_t *img_enc,
          aom_bit_depth_t bit_depth,uint input_bit_depth)

{
  double dVar1;
  int i;
  long lVar2;
  int i_1;
  bool bVar3;
  int crop_heights [2];
  int crop_widths [2];
  double plane_ssim [3];
  
  plane_ssim[0] = 0.0;
  plane_ssim[1] = 0.0;
  plane_ssim[2] = 0.0;
  crop_widths[0] = img_src->d_w;
  crop_heights[0] = img_src->d_h;
  crop_widths[1] = img_src->w + 1 >> 1;
  if (img_src->x_chroma_shift != 1) {
    crop_widths[1] = img_src->w;
  }
  crop_heights[1] = img_src->h + 1 >> 1;
  if (img_src->y_chroma_shift != 1) {
    crop_heights[1] = img_src->h;
  }
  this->nframes_ = this->nframes_ + 1;
  if ((int)bit_depth < 9) {
    lVar2 = 0;
    do {
      bVar3 = lVar2 != 0;
      dVar1 = aom_ssim2(img_src->planes[lVar2],img_enc->planes[lVar2],img_src->stride[bVar3],
                        img_enc->stride[bVar3],crop_widths[bVar3],crop_heights[bVar3]);
      plane_ssim[lVar2] = dVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  else {
    lVar2 = 0;
    do {
      bVar3 = lVar2 != 0;
      dVar1 = aom_highbd_ssim2((uint8_t *)((ulong)img_src->planes[lVar2] >> 1),
                               (uint8_t *)((ulong)img_enc->planes[lVar2] >> 1),
                               img_src->stride[bVar3] >> 1,img_enc->stride[bVar3] >> 1,
                               crop_widths[bVar3],crop_heights[bVar3],input_bit_depth,
                               bit_depth - input_bit_depth & 0xff);
      plane_ssim[lVar2] = dVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  this->ssim_ = plane_ssim[0] * 0.8 + (plane_ssim[1] + plane_ssim[2]) * 0.1 + this->ssim_;
  return;
}

Assistant:

void CalculateFrameLevelSSIM(const aom_image_t *img_src,
                               const aom_image_t *img_enc,
                               aom_bit_depth_t bit_depth,
                               unsigned int input_bit_depth) override {
    double frame_ssim;
    double plane_ssim[MAX_MB_PLANE] = { 0.0, 0.0, 0.0 };
    int crop_widths[PLANE_TYPES];
    int crop_heights[PLANE_TYPES];
    crop_widths[PLANE_TYPE_Y] = img_src->d_w;
    crop_heights[PLANE_TYPE_Y] = img_src->d_h;
    // Width of UV planes calculated based on chroma_shift values.
    crop_widths[PLANE_TYPE_UV] =
        img_src->x_chroma_shift == 1 ? (img_src->w + 1) >> 1 : img_src->w;
    crop_heights[PLANE_TYPE_UV] =
        img_src->y_chroma_shift == 1 ? (img_src->h + 1) >> 1 : img_src->h;
    nframes_++;

#if CONFIG_AV1_HIGHBITDEPTH
    uint8_t is_hbd = bit_depth > AOM_BITS_8;
    if (is_hbd) {
      // HBD ssim calculation.
      uint8_t shift = bit_depth - input_bit_depth;
      for (int i = AOM_PLANE_Y; i < MAX_MB_PLANE; ++i) {
        const int is_uv = i > AOM_PLANE_Y;
        plane_ssim[i] = aom_highbd_ssim2(
            CONVERT_TO_BYTEPTR(img_src->planes[i]),
            CONVERT_TO_BYTEPTR(img_enc->planes[i]),
            img_src->stride[is_uv] >> is_hbd, img_enc->stride[is_uv] >> is_hbd,
            crop_widths[is_uv], crop_heights[is_uv], input_bit_depth, shift);
      }
      frame_ssim = plane_ssim[AOM_PLANE_Y] * .8 +
                   .1 * (plane_ssim[AOM_PLANE_U] + plane_ssim[AOM_PLANE_V]);
      // Accumulate to find sequence level ssim value.
      ssim_ += frame_ssim;
      return;
    }
#else
    (void)bit_depth;
    (void)input_bit_depth;
#endif  // CONFIG_AV1_HIGHBITDEPTH

    // LBD ssim calculation.
    for (int i = AOM_PLANE_Y; i < MAX_MB_PLANE; ++i) {
      const int is_uv = i > AOM_PLANE_Y;
      plane_ssim[i] = aom_ssim2(img_src->planes[i], img_enc->planes[i],
                                img_src->stride[is_uv], img_enc->stride[is_uv],
                                crop_widths[is_uv], crop_heights[is_uv]);
    }
    frame_ssim = plane_ssim[AOM_PLANE_Y] * .8 +
                 .1 * (plane_ssim[AOM_PLANE_U] + plane_ssim[AOM_PLANE_V]);
    // Accumulate to find sequence level ssim value.
    ssim_ += frame_ssim;
  }